

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

void __thiscall
pbrt::MLTSampler::MLTSampler
          (MLTSampler *this,int mutationsPerPixel,int rngSequenceIndex,Float sigma,
          Float largeStepProbability,int streamCount)

{
  undefined4 in_ECX;
  undefined4 in_ESI;
  RNG *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  uint64_t in_stack_ffffffffffffffc8;
  vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
  *this_00;
  polymorphic_allocator<pbrt::MLTSampler::PrimarySample> local_28;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  *(undefined4 *)&in_RDI->state = in_ESI;
  local_1c = in_ECX;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  RNG::RNG(in_RDI,in_stack_ffffffffffffffc8);
  *(undefined4 *)&in_RDI[1].inc = local_14;
  *(undefined4 *)((long)&in_RDI[1].inc + 4) = local_18;
  *(undefined4 *)&in_RDI[2].state = local_1c;
  this_00 = (vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
             *)&in_RDI[2].inc;
  pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::MLTSampler::PrimarySample> *)in_RDI);
  pstd::
  vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
  ::vector(this_00,&local_28);
  in_RDI[4].inc = 0;
  *(undefined1 *)&in_RDI[5].state = 1;
  in_RDI[5].inc = 0;
  return;
}

Assistant:

MLTSampler(int mutationsPerPixel, int rngSequenceIndex, Float sigma,
               Float largeStepProbability, int streamCount)
        : mutationsPerPixel(mutationsPerPixel),
          rng(rngSequenceIndex),
          sigma(sigma),
          largeStepProbability(largeStepProbability),
          streamCount(streamCount) {}